

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ulong __thiscall smf::MidiFile::unpackVLV(MidiFile *this,uchar a,uchar b,uchar c,uchar d,uchar e)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uchar bytes [5];
  byte local_15 [5];
  
  lVar2 = 0;
  do {
    if (-1 < (char)local_15[lVar2]) {
      lVar3 = -1;
      uVar1 = 0;
      do {
        uVar1 = uVar1 << 7 | (ulong)(local_15[lVar3 + 1] & 0x7f);
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
      return uVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"VLV number is too large",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  this->m_rwstatus = false;
  return 0;
}

Assistant:

ulong MidiFile::unpackVLV(uchar a, uchar b, uchar c, uchar d, uchar e) {
	uchar bytes[5] = {a, b, c, d, e};
	int count = 0;
	while ((count < 5) && (bytes[count] > 0x7f)) {
		count++;
	}
	count++;
	if (count >= 6) {
		std::cerr << "VLV number is too large" << std::endl;
		m_rwstatus = false;
		return 0;
	}

	ulong output = 0;
	for (int i=0; i<count; i++) {
		output = output << 7;
		output = output | (bytes[i] & 0x7f);
	}

	return output;
}